

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_state_user(Curl_easy *data,connectdata *conn)

{
  undefined1 *puVar1;
  CURLcode CVar2;
  connectdata *conn_1;
  char *pcVar3;
  
  pcVar3 = "";
  if (conn->user != (char *)0x0) {
    pcVar3 = conn->user;
  }
  CVar2 = Curl_pp_sendf(data,&(conn->proto).ftpc.pp,"USER %s",pcVar3);
  if (CVar2 == CURLE_OK) {
    (data->conn->proto).ftpc.state = FTP_USER;
    puVar1 = &(data->state).field_0x660;
    *puVar1 = *puVar1 & 0xbf;
  }
  return CVar2;
}

Assistant:

static CURLcode ftp_state_user(struct Curl_easy *data,
                               struct connectdata *conn)
{
  CURLcode result = Curl_pp_sendf(data,
                                  &conn->proto.ftpc.pp, "USER %s",
                                  conn->user?conn->user:"");
  if(!result) {
    state(data, FTP_USER);
    data->state.ftp_trying_alternative = FALSE;
  }
  return result;
}